

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void collect_init_els(c2m_ctx_t c2m_ctx,decl_t member_decl,type **type_ptr,
                     node_t_conflict initializer,int const_only_p,int top_p)

{
  node_code_t nVar1;
  gen_ctx_conflict *pgVar2;
  type *arr_type;
  node_t pnVar3;
  byte *pbVar4;
  init_object_t obj;
  init_object_t obj_00;
  init_el_t obj_01;
  bool bVar5;
  int iVar6;
  node_t_conflict pnVar7;
  node_t_conflict pnVar8;
  size_t sVar9;
  mir_llong mVar10;
  ulong uVar11;
  init_object_t *__return_storage_ptr__;
  bool bVar12;
  VARR_init_object_t *varr;
  node_t pnVar13;
  type *type;
  node_t n;
  init_object_t local_110;
  decl_t local_f8;
  int local_ec;
  symbol_t sym;
  int addr_p;
  pos_t local_a8;
  pos_t local_98;
  pos_t local_88;
  init_object_t local_78;
  init_object_t local_60;
  init_object_t local_48;
  
  pgVar2 = c2m_ctx->gen_ctx;
  arr_type = *type_ptr;
  addr_p = 0;
  local_f8 = member_decl;
  pnVar7 = get_compound_literal(initializer,&addr_p);
  local_ec = addr_p;
  if ((addr_p == 0 && pnVar7 != (node_t_conflict)0x0) && (2 < initializer->code - N_STR)) {
    initializer = DLIST_node_t_el(&(pnVar7->u).ops,1);
  }
  bVar5 = top_p == 0;
  while (bVar12 = bVar5, nVar1 = initializer->code, sym._0_8_ = c2m_ctx,
        sym.aux_node = (node_t_conflict)arr_type, nVar1 == N_LIST) {
    n = (initializer->u).ops.head;
    if (n == (node_t)0x0) {
      return;
    }
    if (n->code != N_INIT) goto LAB_0017583e;
    pnVar8 = DLIST_node_t_el(&(initializer->u).ops,1);
    if ((((pnVar8 == (node_t_conflict)0x0) && (pnVar13 = (n->u).ops.head, pnVar13->code == N_LIST))
        && ((pnVar13->u).s.s == (char *)0x0)) &&
       ((initializer = DLIST_node_t_el(&(n->u).ops,1), initializer != (node_t_conflict)0x0 &&
        (initializer->code - N_STR < 3)))) {
      if (arr_type->mode == TM_ARR) goto LAB_0017515b;
LAB_00175181:
      if (n->code != N_INIT) {
LAB_0017583e:
        __assert_fail("init->code == N_INIT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2cf2,
                      "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
      }
    }
    pnVar13 = (n->u).ops.head;
    if (pnVar13->code != N_LIST) {
      __assert_fail("des_list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf4,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (arr_type->mode - TM_STRUCT < 3) {
      sVar9 = VARR_init_object_tlength(c2m_ctx->init_object_path);
      local_110.field_designator_p = 0;
      local_110.container_type = arr_type;
      if (arr_type->mode == TM_ARR) {
        mVar10 = get_arr_type_size(arr_type);
        if (mVar10 < 0) {
          __assert_fail("size_val >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2d02,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        local_110.u.curr_index = -1;
      }
      else {
        local_110.u.curr_index = 0;
      }
      obj._12_4_ = local_110._12_4_;
      obj.field_designator_p = local_110.field_designator_p;
      obj.container_type = local_110.container_type;
      obj.u.curr_index = local_110.u.curr_index;
      VARR_init_object_tpush(c2m_ctx->init_object_path,obj);
      local_f8 = (decl_t)(sVar9 + 1);
      do {
        if (n == (node_t_conflict)0x0) {
          VARR_init_object_ttrunc(c2m_ctx->init_object_path,sVar9);
          return;
        }
        if (n->code != N_INIT) {
          __assert_fail("init->code == N_INIT",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2d09,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        pnVar13 = (n->u).ops.head;
        pnVar7 = (pnVar13->op_link).next;
        if (((pnVar7->code == N_LIST) || (pnVar7->code == N_COMPOUND_LITERAL)) &&
           (2 < arr_type->mode - TM_STRUCT)) {
          __assert_fail("(value->code != N_LIST && value->code != N_COMPOUND_LITERAL) || type->mode == TM_ARR || type->mode == TM_STRUCT || type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2d0d,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        pnVar13 = (pnVar13->u).ops.head;
        if (pnVar13 == (node_t)0x0) {
          local_88 = get_node_pos(c2m_ctx,n);
          iVar6 = update_path_and_do(c2m_ctx,1,collect_init_els,sVar9,pnVar7,const_only_p,
                                     (mir_llong *)0x0,local_88,"");
          if (iVar6 == 0) {
            __assert_fail("ok_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2d11,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
        }
        else {
          VARR_init_object_ttrunc(c2m_ctx->init_object_path,(size_t)local_f8);
          bVar5 = false;
          type = arr_type;
          for (; pnVar13 != (node_t)0x0; pnVar13 = (pnVar13->op_link).next) {
            VARR_init_object_tlast(&local_110,c2m_ctx->init_object_path);
            if (bVar5) {
              if ((local_110.container_type)->mode - TM_STRUCT < 2) {
                type = *(type **)((long)(local_110.u.curr_member)->attr + 0x40);
              }
              else {
                if ((local_110.container_type)->mode != TM_ARR) {
                  __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                ,0x2d21,
                                "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                               );
                }
                type = (((local_110.container_type)->u).ptr_type)->arr_type;
              }
            }
            else {
              VARR_init_object_tpop(&local_78,c2m_ctx->init_object_path);
            }
            if (pnVar13->code == N_FIELD_ID) {
              if ((type->mode & ~TM_BASIC) != TM_STRUCT) {
                __assert_fail("curr_type->mode == TM_STRUCT || curr_type->mode == TM_UNION",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d2a,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              iVar6 = symbol_find(c2m_ctx,S_REGULAR,(pnVar13->u).ops.head,(type->u).tag_type,&sym);
              if (iVar6 == 0) {
                __assert_fail("found_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d2c,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              process_init_field_designator(c2m_ctx,sym.def_node,type);
              pnVar3 = (pnVar13->op_link).next;
              local_98 = get_node_pos(c2m_ctx,n);
              iVar6 = update_path_and_do(c2m_ctx,(uint)(pnVar3 == (node_t)0x0),collect_init_els,
                                         sVar9,pnVar7,const_only_p,(mir_llong *)0x0,local_98,"");
              if (iVar6 == 0) {
                __assert_fail("ok_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d30,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
            }
            else {
              if (((((type->mode != TM_ARR) || (pbVar4 = (byte *)pnVar13->attr, (*pbVar4 & 1) == 0))
                   || (iVar6 = integer_type_p(*(type **)(pbVar4 + 0x18)), iVar6 == 0)) ||
                  ((iVar6 = incomplete_type_p(c2m_ctx,type), iVar6 != 0 ||
                   (uVar11 = get_arr_type_size(type), (long)uVar11 < 0)))) ||
                 (uVar11 <= *(ulong *)(pbVar4 + 0x30))) {
                __assert_fail("curr_type->mode == TM_ARR && cexpr->const_p && integer_type_p (cexpr->type) && !incomplete_type_p (c2m_ctx, curr_type) && (arr_size_val = get_arr_type_size (curr_type)) >= 0 && (mir_ullong) arr_size_val > cexpr->c.u_val"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d37,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              local_110.u.curr_member = (node_t_conflict)(*(ulong *)(pbVar4 + 0x30) - 1);
              local_110.field_designator_p = 0;
              obj_00._8_8_ = (ulong)(uint)local_110._12_4_ << 0x20;
              obj_00.container_type = type;
              obj_00.u.curr_member = (node_t_conflict)local_110.u.curr_index;
              local_110.container_type = type;
              VARR_init_object_tpush(c2m_ctx->init_object_path,obj_00);
              pnVar3 = (pnVar13->op_link).next;
              local_a8 = get_node_pos(c2m_ctx,n);
              iVar6 = update_path_and_do(c2m_ctx,(uint)(pnVar3 == (node_t)0x0),collect_init_els,
                                         sVar9,pnVar7,const_only_p,(mir_llong *)0x0,local_a8,"");
              if (iVar6 == 0) {
                __assert_fail("ok_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d3e,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
            }
            bVar5 = true;
          }
        }
        n = (n->op_link).next;
      } while( true );
    }
    if (((n->op_link).next != (node_t)0x0) || ((pnVar13->u).s.s != (char *)0x0)) {
      __assert_fail("NL_NEXT (init) == NULL && NL_HEAD (des_list->u.ops) == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf6,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    initializer = (pnVar13->op_link).next;
    bVar5 = true;
    if (bVar12) {
      __assert_fail("top_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf8,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
  }
  if (nVar1 == N_STR) {
    if ((arr_type->mode != TM_ARR) ||
       (iVar6 = init_compatible_string_p(initializer,((arr_type->u).ptr_type)->arr_type), iVar6 == 0
       )) goto LAB_00175297;
    n = (initializer->u).ops.head;
LAB_0017515b:
    iVar6 = init_compatible_string_p(initializer,((arr_type->u).ptr_type)->arr_type);
    if (iVar6 == 0) {
      if (n == (node_t)0x0) {
        return;
      }
      goto LAB_00175181;
    }
    sym.id = (node_t_conflict)VARR_init_el_tlength(pgVar2->init_els);
    sym.scope = (node_t_conflict)get_object_path_offset(c2m_ctx);
    sym.def_node = (node_t_conflict)0x0;
    sVar9 = VARR_init_object_tlength(c2m_ctx->init_object_path);
    if (sVar9 == 0) goto LAB_00175377;
    varr = c2m_ctx->init_object_path;
    __return_storage_ptr__ = &local_60;
  }
  else {
    if (((1 < nVar1 - N_STR) && (const_only_p != 0)) && (nVar1 != N_STR32)) {
      if (((*initializer->attr & 3) == 0) && (pnVar7 == (node_t_conflict)0x0 || local_ec == 0)) {
        __assert_fail("initializer->code == N_STR || initializer->code == N_STR16 || initializer->code == N_STR32 || !const_only_p || cexpr->const_p || cexpr->const_addr_p || (literal != NULL && addr_p)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2ccf,
                      "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
      }
    }
LAB_00175297:
    sym.id = (node_t_conflict)VARR_init_el_tlength(pgVar2->init_els);
    sym.scope = (node_t_conflict)get_object_path_offset(c2m_ctx);
    sym.def_node = (node_t_conflict)local_f8;
    sVar9 = VARR_init_object_tlength(c2m_ctx->init_object_path);
    if (sVar9 == 0) {
LAB_00175377:
      sym.defs = (VARR_node_t *)0x0;
      goto LAB_00175379;
    }
    varr = c2m_ctx->init_object_path;
    __return_storage_ptr__ = &local_48;
  }
  VARR_init_object_tlast(__return_storage_ptr__,varr);
  sym.defs = (VARR_node_t *)__return_storage_ptr__->container_type;
LAB_00175379:
  obj_01.num = (mir_size_t)sym.id;
  obj_01.c2m_ctx = (c2m_ctx_t)sym._0_8_;
  obj_01.offset = (mir_size_t)sym.scope;
  obj_01.member_decl = (decl_t)sym.def_node;
  obj_01.el_type = (type *)sym.aux_node;
  obj_01.container_type = (type *)sym.defs;
  obj_01.init = initializer;
  VARR_init_el_tpush(pgVar2->init_els,obj_01);
  return;
}

Assistant:

static void collect_init_els (c2m_ctx_t c2m_ctx, decl_t member_decl, struct type **type_ptr,
                              node_t initializer, int const_only_p, int top_p MIR_UNUSED) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  struct type *type = *type_ptr;
  struct expr *cexpr;
  node_t literal, des_list, curr_des, str, init, value;
  mir_llong MIR_UNUSED size_val = 0; /* to remove an uninitialized warning */
  size_t mark;
  symbol_t sym;
  init_el_t init_el;
  int addr_p = FALSE; /* to remove an uninitialized warning */
  int MIR_UNUSED found_p, MIR_UNUSED ok_p;
  init_object_t init_object;

  literal = get_compound_literal (initializer, &addr_p);
  if (literal != NULL && !addr_p && initializer->code != N_STR && initializer->code != N_STR16
      && initializer->code != N_STR32)
    initializer = NL_EL (literal->u.ops, 1);
check_one_value:
  if (initializer->code != N_LIST
      && !(initializer->code == N_STR && type->mode == TM_ARR
           && init_compatible_string_p (initializer, type->u.arr_type->el_type))) {
    cexpr = initializer->attr;
    /* static or thread local object initialization should be const expr or addr: */
    assert (initializer->code == N_STR || initializer->code == N_STR16
            || initializer->code == N_STR32 || !const_only_p || cexpr->const_p
            || cexpr->const_addr_p || (literal != NULL && addr_p));
    init_el.c2m_ctx = c2m_ctx;
    init_el.num = VARR_LENGTH (init_el_t, init_els);
    init_el.offset = get_object_path_offset (c2m_ctx);
    init_el.member_decl = member_decl;
    init_el.el_type = type;
    init_el.container_type = VARR_LENGTH (init_object_t, init_object_path) == 0
                               ? NULL
                               : VARR_LAST (init_object_t, init_object_path).container_type;
    init_el.init = initializer;
    VARR_PUSH (init_el_t, init_els, init_el);
    return;
  }
  init = NL_HEAD (initializer->u.ops);
  if (((str = initializer)->code == N_STR || str->code == N_STR16
       || str->code == N_STR32 /* string or string in parentheses  */
       || (init != NULL && init->code == N_INIT && NL_EL (initializer->u.ops, 1) == NULL
           && (des_list = NL_HEAD (init->u.ops))->code == N_LIST
           && NL_HEAD (des_list->u.ops) == NULL && NL_EL (init->u.ops, 1) != NULL
           && ((str = NL_EL (init->u.ops, 1))->code == N_STR || str->code == N_STR16
               || str->code == N_STR32)))
      && type->mode == TM_ARR && init_compatible_string_p (str, type->u.arr_type->el_type)) {
    init_el.c2m_ctx = c2m_ctx;
    init_el.num = VARR_LENGTH (init_el_t, init_els);
    init_el.offset = get_object_path_offset (c2m_ctx);
    init_el.member_decl = NULL;
    init_el.el_type = type;
    init_el.container_type = VARR_LENGTH (init_object_t, init_object_path) == 0
                               ? NULL
                               : VARR_LAST (init_object_t, init_object_path).container_type;
    init_el.init = str;
    VARR_PUSH (init_el_t, init_els, init_el);
    return;
  }
  if (init == NULL) return;
  assert (init->code == N_INIT);
  des_list = NL_HEAD (init->u.ops);
  assert (des_list->code == N_LIST);
  if (type->mode != TM_ARR && type->mode != TM_STRUCT && type->mode != TM_UNION) {
    assert (NL_NEXT (init) == NULL && NL_HEAD (des_list->u.ops) == NULL);
    initializer = NL_NEXT (des_list);
    assert (top_p);
    top_p = FALSE;
    goto check_one_value;
  }
  mark = VARR_LENGTH (init_object_t, init_object_path);
  init_object.container_type = type;
  init_object.field_designator_p = FALSE;
  if (type->mode == TM_ARR) {
    size_val = get_arr_type_size (type);
    /* we already figured out the array size during check: */
    assert (size_val >= 0);
    init_object.u.curr_index = -1;
  } else {
    init_object.u.curr_member = NULL;
  }
  VARR_PUSH (init_object_t, init_object_path, init_object);
  for (; init != NULL; init = NL_NEXT (init)) {
    assert (init->code == N_INIT);
    des_list = NL_HEAD (init->u.ops);
    value = NL_NEXT (des_list);
    assert ((value->code != N_LIST && value->code != N_COMPOUND_LITERAL) || type->mode == TM_ARR
            || type->mode == TM_STRUCT || type->mode == TM_UNION);
    if ((curr_des = NL_HEAD (des_list->u.ops)) == NULL) {
      ok_p = update_path_and_do (c2m_ctx, TRUE, collect_init_els, mark, value, const_only_p, NULL,
                                 POS (init), "");
      assert (ok_p);
    } else {
      struct type *curr_type = type;
      mir_llong arr_size_val MIR_UNUSED;
      int first_p = TRUE;

      VARR_TRUNC (init_object_t, init_object_path, mark + 1);
      for (; curr_des != NULL; curr_des = NL_NEXT (curr_des), first_p = FALSE) {
        init_object = VARR_LAST (init_object_t, init_object_path);
        if (first_p) {
          VARR_POP (init_object_t, init_object_path);
        } else {
          if (init_object.container_type->mode == TM_ARR) {
            curr_type = init_object.container_type->u.arr_type->el_type;
          } else {
            assert (init_object.container_type->mode == TM_STRUCT
                    || init_object.container_type->mode == TM_UNION);
            decl_t el_decl = init_object.u.curr_member->attr;
            curr_type = el_decl->decl_spec.type;
          }
        }
        if (curr_des->code == N_FIELD_ID) {
          node_t id = NL_HEAD (curr_des->u.ops);

          /* field should be only in struct/union initializer */
          assert (curr_type->mode == TM_STRUCT || curr_type->mode == TM_UNION);
          found_p = symbol_find (c2m_ctx, S_REGULAR, id, curr_type->u.tag_type, &sym);
          assert (found_p); /* field should present */
          process_init_field_designator (c2m_ctx, sym.def_node, curr_type);
          ok_p = update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, collect_init_els, mark,
                                     value, const_only_p, NULL, POS (init), "");
          assert (ok_p);
        } else {
          cexpr = curr_des->attr;
          /* index should be in array initializer and const expr of right type and value: */
          assert (curr_type->mode == TM_ARR && cexpr->const_p && integer_type_p (cexpr->type)
                  && !incomplete_type_p (c2m_ctx, curr_type)
                  && (arr_size_val = get_arr_type_size (curr_type)) >= 0
                  && (mir_ullong) arr_size_val > cexpr->c.u_val);
          init_object.u.curr_index = cexpr->c.i_val - 1;
          init_object.field_designator_p = FALSE;
          init_object.container_type = curr_type;
          VARR_PUSH (init_object_t, init_object_path, init_object);
          ok_p = update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, collect_init_els, mark,
                                     value, const_only_p, NULL, POS (init), "");
          assert (ok_p);
        }
      }
    }
  }
  VARR_TRUNC (init_object_t, init_object_path, mark);
}